

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeSetSensMaxNonlinIters(void *cvode_mem,int maxcorS)

{
  int iVar1;
  int error_code;
  undefined4 in_register_00000034;
  long lVar2;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    iVar1 = 0x450;
  }
  else if ((*(int *)((long)cvode_mem + 0x8c) == 0) || (*(int *)((long)cvode_mem + 0x94) != 2)) {
    lVar2 = *(long *)((long)cvode_mem + 0x758);
    if (lVar2 != 0) goto LAB_00121e8c;
    msgfmt = "A memory request failed.";
    error_code = -0x14;
    iVar1 = 0x46a;
  }
  else {
    lVar2 = *(long *)((long)cvode_mem + 0x748);
    if (lVar2 != 0) {
LAB_00121e8c:
      iVar1 = SUNNonlinSolSetMaxIters(lVar2,CONCAT44(in_register_00000034,maxcorS));
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    error_code = -0x14;
    iVar1 = 0x45e;
  }
  cvProcessError((CVodeMem)0x0,error_code,iVar1,"CVodeSetSensMaxNonlinIters",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetSensMaxNonlinIters(void* cvode_mem, int maxcorS)
{
  CVodeMem cv_mem;
  sunbooleantype sensi_stg;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* Are we computing sensitivities with a staggered approach? */
  sensi_stg = (cv_mem->cv_sensi && (cv_mem->cv_ism == CV_STAGGERED));

  if (sensi_stg)
  {
    /* check that the NLS is non-NULL */
    if (cv_mem->NLSstg == NULL)
    {
      cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(cv_mem->NLSstg, maxcorS));
  }
  else
  {
    /* check that the NLS is non-NULL */
    if (cv_mem->NLSstg1 == NULL)
    {
      cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(cv_mem->NLSstg1, maxcorS));
  }

  return (CV_SUCCESS);
}